

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::handleIndexLimits
          (TParseContext *this,TSourceLoc *param_1,TIntermTyped *base,TIntermTyped *index)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TLimits *pTVar4;
  undefined4 extraout_var_02;
  long lVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TIntermTyped *local_18;
  
  pTVar4 = this->limits;
  local_18 = index;
  if (pTVar4->generalSamplerIndexing == false) {
    iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base);
    if (iVar3 == 0xe) goto LAB_0040cdcf;
    pTVar4 = this->limits;
  }
  if (pTVar4->generalUniformIndexing == false) {
    iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x21])(base);
    if ((0xfffffffd < (*(uint *)(CONCAT44(extraout_var,iVar3) + 8) & 0x7f) - 7) &&
       ((this->super_TParseContextBase).super_TParseVersions.language != EShLangVertex))
    goto LAB_0040cdcf;
    pTVar4 = this->limits;
  }
  if (pTVar4->generalAttributeMatrixVectorIndexing == false) {
    iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x21])(base);
    uVar1 = *(uint *)(CONCAT44(extraout_var_00,iVar3) + 8);
    if ((((uVar1 & 0x7f) < 0x1c) && ((0xe300008U >> (uVar1 & 0x1f) & 1) != 0)) &&
       ((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex)) {
      iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0xe0))
                        ((long *)CONCAT44(extraout_var_06,iVar3));
      if (cVar2 != '\0') goto LAB_0040cdcf;
      iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0xd8))
                        ((long *)CONCAT44(extraout_var_07,iVar3));
      if (cVar2 != '\0') goto LAB_0040cdcf;
    }
  }
  pTVar4 = this->limits;
  if (pTVar4->generalConstantMatrixVectorIndexing == false) {
    iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[5])(base);
    if (CONCAT44(extraout_var_01,iVar3) != 0) goto LAB_0040cdcf;
    pTVar4 = this->limits;
  }
  if (pTVar4->generalVariableIndexing == false) {
    iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x58))
                      ((long *)CONCAT44(extraout_var_02,iVar3));
    if (1 < (*(uint *)(lVar5 + 8) & 0x7f) - 5) {
      iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x58))
                        ((long *)CONCAT44(extraout_var_03,iVar3));
      if ((0x1b < (*(uint *)(lVar5 + 8) & 0x7f)) ||
         ((0xe300008U >> (*(uint *)(lVar5 + 8) & 0x1f) & 1) == 0)) {
        iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
        lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar3) + 0x58))
                          ((long *)CONCAT44(extraout_var_08,iVar3));
        if ((0x1e < (*(uint *)(lVar5 + 8) & 0x7f)) ||
           ((0x71c00010U >> (*(uint *)(lVar5 + 8) & 0x1f) & 1) == 0)) {
          iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
          lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar3) + 0x58))
                            ((long *)CONCAT44(extraout_var_09,iVar3));
          if ((*(ulong *)(lVar5 + 8) & 0x10000007f) != 2 && (*(ulong *)(lVar5 + 8) >> 0x20 & 1) == 0
             ) goto LAB_0040cdcf;
        }
      }
    }
  }
  if (this->limits->generalVaryingIndexing != false) {
    return;
  }
  iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x58))
                    ((long *)CONCAT44(extraout_var_04,iVar3));
  if ((0x1b < (*(uint *)(lVar5 + 8) & 0x7f)) ||
     ((0xe300008U >> (*(uint *)(lVar5 + 8) & 0x1f) & 1) == 0)) {
    iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x58))
                      ((long *)CONCAT44(extraout_var_05,iVar3));
    if (0x1e < (*(uint *)(lVar5 + 8) & 0x7f)) {
      return;
    }
    if ((0x71c00010U >> (*(uint *)(lVar5 + 8) & 0x1f) & 1) == 0) {
      return;
    }
  }
LAB_0040cdcf:
  std::vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>::push_back
            (&(this->needsIndexLimitationChecking).
              super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
             ,&local_18);
  return;
}

Assistant:

void TParseContext::handleIndexLimits(const TSourceLoc& /*loc*/, TIntermTyped* base, TIntermTyped* index)
{
    if ((! limits.generalSamplerIndexing && base->getBasicType() == EbtSampler) ||
        (! limits.generalUniformIndexing && base->getQualifier().isUniformOrBuffer() && language != EShLangVertex) ||
        (! limits.generalAttributeMatrixVectorIndexing && base->getQualifier().isPipeInput() && language == EShLangVertex && (base->getType().isMatrix() || base->getType().isVector())) ||
        (! limits.generalConstantMatrixVectorIndexing && base->getAsConstantUnion()) ||
        (! limits.generalVariableIndexing && ! base->getType().getQualifier().isUniformOrBuffer() &&
                                             ! base->getType().getQualifier().isPipeInput() &&
                                             ! base->getType().getQualifier().isPipeOutput() &&
                                             ! base->getType().getQualifier().isConstant()) ||
        (! limits.generalVaryingIndexing && (base->getType().getQualifier().isPipeInput() ||
                                                base->getType().getQualifier().isPipeOutput()))) {
        // it's too early to know what the inductive variables are, save it for post processing
        needsIndexLimitationChecking.push_back(index);
    }
}